

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong unaff_RBX;
  secp256k1_modinv64_signed62 *psVar9;
  undefined4 in_register_0000003c;
  uchar *out32;
  secp256k1_sha256 *psVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong unaff_R14;
  ulong unaff_R15;
  byte bVar15;
  secp256k1_fe sStack_130;
  uchar *puStack_100;
  secp256k1_sha256 *psStack_f8;
  uchar auStack_ec [4];
  secp256k1_sha256 sStack_e8;
  ulong uStack_80;
  ulong uStack_78;
  code *pcStack_70;
  int local_64;
  uchar *local_60;
  secp256k1_modinv64_signed62 *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  out32 = (uchar *)CONCAT44(in_register_0000003c,len);
  bVar15 = 0;
  if (len < 1) {
LAB_0011bbc6:
    pcStack_70 = (code *)0x11bbcb;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011bbcb:
    pcStack_70 = (code *)0x11bbd0;
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0011bbd0:
    pcStack_70 = (code *)0x11bbd5;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011bbd5:
    pcStack_70 = (code *)0x11bbda;
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_0011bbda:
    pcStack_70 = (code *)0x11bbdf;
    secp256k1_modinv64_update_fg_62_var_cold_4();
  }
  else {
    unaff_R15 = 0x7fffffffffffffff;
    local_38 = t->u;
    local_40 = t->v;
    lVar11 = f->v[0];
    lVar7 = g->v[0];
    unaff_R14 = lVar11 * local_38;
    unaff_RBX = SUB168(SEXT816(lVar11) * SEXT816(local_38),8);
    uVar2 = lVar7 * local_40;
    lVar5 = SUB168(SEXT816(lVar7) * SEXT816(local_40),8);
    lVar6 = (0x7fffffffffffffff - lVar5) - unaff_RBX;
    if (-1 < lVar5 &&
        (SBORROW8(0x7fffffffffffffff - lVar5,unaff_RBX) !=
        SBORROW8(lVar6,(ulong)(~uVar2 < unaff_R14))) !=
        (long)(lVar6 - (ulong)(~uVar2 < unaff_R14)) < 0) goto LAB_0011bbcb;
    local_48 = t->q;
    uVar12 = uVar2 + unaff_R14;
    lVar5 = lVar5 + unaff_RBX + (ulong)CARRY8(uVar2,unaff_R14);
    local_50 = t->r;
    unaff_RBX = lVar11 * local_48;
    lVar6 = SUB168(SEXT816(lVar11) * SEXT816(local_48),8);
    uVar2 = lVar7 * local_50;
    lVar7 = SUB168(SEXT816(lVar7) * SEXT816(local_50),8);
    unaff_R14 = -uVar2 - 1;
    lVar11 = (0x7fffffffffffffff - lVar7) - lVar6;
    if (-1 < lVar7 &&
        (SBORROW8(0x7fffffffffffffff - lVar7,lVar6) !=
        SBORROW8(lVar11,(ulong)(unaff_R14 < unaff_RBX))) !=
        (long)(lVar11 - (ulong)(unaff_R14 < unaff_RBX)) < 0) goto LAB_0011bbd0;
    lVar11 = lVar7 + lVar6 + (ulong)CARRY8(uVar2,unaff_RBX);
    if ((uVar12 & 0x3fffffffffffffff) != 0) goto LAB_0011bbd5;
    if ((uVar2 + unaff_RBX & 0x3fffffffffffffff) != 0) goto LAB_0011bbda;
    uVar2 = uVar2 + unaff_RBX >> 0x3e | lVar11 * 4;
    uVar12 = uVar12 >> 0x3e | lVar5 * 4;
    lVar11 = lVar11 >> 0x3e;
    lVar5 = lVar5 >> 0x3e;
    local_64 = len;
    if (len != 1) {
      local_60 = (uchar *)(ulong)(uint)len;
      out32 = (uchar *)0x1;
      do {
        lVar7 = f->v[(long)out32];
        unaff_R14 = lVar7 * local_38 + uVar12;
        unaff_RBX = SUB168(SEXT816(lVar7) * SEXT816(local_38),8) + lVar5 +
                    (ulong)CARRY8(lVar7 * local_38,uVar12);
        lVar6 = g->v[(long)out32];
        unaff_R15 = lVar6 * local_40;
        lVar8 = SUB168(SEXT816(lVar6) * SEXT816(local_40),8);
        uVar12 = (ulong)(-unaff_R15 - 1 < unaff_R14);
        lVar5 = (0x7fffffffffffffff - lVar8) - unaff_RBX;
        psVar9 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar13 = (-0x8000000000000000 - lVar8) - (ulong)(unaff_R15 != 0);
        lVar14 = unaff_RBX - lVar13;
        bVar1 = (SBORROW8(0x7fffffffffffffff - lVar8,unaff_RBX) != SBORROW8(lVar5,uVar12)) ==
                (long)(lVar5 - uVar12) < 0;
        if (lVar8 < 0) {
          bVar1 = (SBORROW8(unaff_RBX,lVar13) != SBORROW8(lVar14,(ulong)(unaff_R14 < -unaff_R15)))
                  == (long)(lVar14 - (ulong)(unaff_R14 < -unaff_R15)) < 0;
        }
        local_58 = f;
        if (!bVar1) {
          pcStack_70 = (code *)0x11bbc1;
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0011bbc1:
          f = psVar9;
          pcStack_70 = (code *)0x11bbc6;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_0011bbc6;
        }
        uVar4 = lVar7 * local_48 + uVar2;
        lVar14 = SUB168(SEXT816(lVar7) * SEXT816(local_48),8) + lVar11 +
                 (ulong)CARRY8(lVar7 * local_48,uVar2);
        uVar3 = lVar6 * local_50;
        lVar6 = SUB168(SEXT816(lVar6) * SEXT816(local_50),8);
        uVar2 = (ulong)(-uVar3 - 1 < uVar4);
        lVar11 = (0x7fffffffffffffff - lVar6) - lVar14;
        lVar5 = (-0x8000000000000000 - lVar6) - (ulong)(uVar3 != 0);
        lVar7 = lVar14 - lVar5;
        bVar1 = (SBORROW8(0x7fffffffffffffff - lVar6,lVar14) != SBORROW8(lVar11,uVar2)) ==
                (long)(lVar11 - uVar2) < 0;
        if (lVar6 < 0) {
          bVar1 = (SBORROW8(lVar14,lVar5) != SBORROW8(lVar7,(ulong)(uVar4 < -uVar3))) ==
                  (long)(lVar7 - (ulong)(uVar4 < -uVar3)) < 0;
        }
        if (!bVar1) goto LAB_0011bbc1;
        lVar5 = lVar8 + unaff_RBX + (ulong)CARRY8(unaff_R15,unaff_R14);
        lVar11 = lVar6 + lVar14 + (ulong)CARRY8(uVar3,uVar4);
        uVar12 = lVar5 * 4 | unaff_R15 + unaff_R14 >> 0x3e;
        unaff_R15 = unaff_R15 + unaff_R14 & 0x3fffffffffffffff;
        f->v[(long)(out32 + -1)] = unaff_R15;
        uVar2 = lVar11 * 4 | uVar3 + uVar4 >> 0x3e;
        g->v[(long)(out32 + -1)] = uVar3 + uVar4 & 0x3fffffffffffffff;
        out32 = out32 + 1;
        lVar11 = lVar11 >> 0x3e;
        lVar5 = lVar5 >> 0x3e;
      } while (local_60 != out32);
    }
    if (lVar5 + -1 + (ulong)(0x7fffffffffffffff < uVar12) == -1) {
      f->v[(long)len + -1] = uVar12;
      if (lVar11 + -1 + (ulong)(0x7fffffffffffffff < uVar2) == -1) {
        g->v[(long)len + -1] = uVar2;
        return;
      }
      goto LAB_0011bbe4;
    }
  }
  pcStack_70 = (code *)0x11bbe4;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011bbe4:
  pcStack_70 = secp256k1_ellswift_prng;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psVar10 = &sStack_e8;
  uStack_80 = unaff_RBX;
  uStack_78 = unaff_R14;
  pcStack_70 = (code *)unaff_R15;
  for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(int64_t *)psVar10->s = f->v[0];
    f = (secp256k1_modinv64_signed62 *)((long)f + ((ulong)bVar15 * -2 + 1) * 8);
    psVar10 = (secp256k1_sha256 *)((long)psVar10 + (ulong)bVar15 * -0x10 + 8);
  }
  uVar2 = sStack_e8.bytes >> 6;
  psStack_f8 = (secp256k1_sha256 *)0x11bc21;
  secp256k1_sha256_write(&sStack_e8,auStack_ec,4);
  psStack_f8 = (secp256k1_sha256 *)0x11bc2c;
  psVar10 = &sStack_e8;
  secp256k1_sha256_finalize(&sStack_e8,out32);
  if (sStack_e8.bytes >> 6 == uVar2 + 1) {
    return;
  }
  psStack_f8 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
  secp256k1_ellswift_prng_cold_1();
  puStack_100 = out32;
  psStack_f8 = &sStack_e8;
  secp256k1_fe_sqr(&sStack_130,(secp256k1_fe *)psVar10);
  secp256k1_fe_mul(&sStack_130,&sStack_130,(secp256k1_fe *)psVar10);
  secp256k1_fe_verify(&sStack_130);
  sStack_130.n[0] = sStack_130.n[0] + 2;
  sStack_130.magnitude = sStack_130.magnitude + 1;
  sStack_130.normalized = 0;
  secp256k1_fe_verify(&sStack_130);
  secp256k1_fe_is_square_var(&sStack_130);
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}